

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O3

void __thiscall
MaterialSystemTest_testMaterialNameAccess_Test::TestBody
          (MaterialSystemTest_testMaterialNameAccess_Test *this)

{
  bool bVar1;
  aiMaterial *paVar2;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  aiMaterial *mat;
  int retValue;
  aiString name;
  AssertHelper local_448;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_440;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  AssertHelper local_430;
  aiMaterial *local_428;
  int local_41c;
  undefined1 local_418 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410 [128];
  
  paVar2 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar2);
  local_440.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_428 = paVar2;
  testing::internal::CmpHelperNE<decltype(nullptr),aiMaterial*>
            ((internal *)local_418,"nullptr","mat",&local_440.ptr_,&local_428);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_440);
    if (local_410[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_410[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=(&local_448,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    if (local_440.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_440.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_440.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_410,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aiMaterial::GetName((aiString *)local_418,local_428);
  local_41c = strncmp(local_418 + 4,"DefaultMaterial",(ulong)(uint)local_418._0_4_);
  local_448.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_440,"0","retValue",(int *)&local_448,&local_41c);
  if (local_440.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_448);
    if (local_438.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_438.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x8b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_430,(Message *)&local_448);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    if (CONCAT44(local_448.data_._4_4_,local_448.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_448.data_._4_4_,local_448.data_._0_4_) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT44(local_448.data_._4_4_,local_448.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_438,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar2 = local_428;
  if (local_428 != (aiMaterial *)0x0) {
    aiMaterial::~aiMaterial(local_428);
  }
  operator_delete(paVar2);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testMaterialNameAccess) {
    aiMaterial *mat = new aiMaterial();
    EXPECT_NE(nullptr, mat);

    aiString name = mat->GetName();
    const int retValue(strncmp(name.C_Str(), AI_DEFAULT_MATERIAL_NAME, name.length));
    EXPECT_EQ(0, retValue );

    delete mat;
}